

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTrig>::HDivDirections
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTrig> *this,TPZVec<double> *pt,
          TPZFMatrix<Fad<double>_> *directions)

{
  double *pdVar1;
  TPZVec<double> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZFNMatrix<9,_Fad<double>_> gradxFad;
  int j;
  int i;
  TPZManVector<Fad<double>,_10> qsiFad;
  TPZFNMatrix<9,_double> gradxinv;
  TPZFNMatrix<9,_double> gradx;
  undefined4 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  Fad<double> *in_stack_fffffffffffffa50;
  double *in_stack_fffffffffffffa58;
  TPZManVector<Fad<double>,_10> *in_stack_fffffffffffffa60;
  double *pdVar2;
  DecomposeType dec;
  TPZFMatrix<double> *in_stack_fffffffffffffa80;
  TPZMatrix<double> *in_stack_fffffffffffffa88;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffa90;
  int64_t in_stack_fffffffffffffaa0;
  int64_t in_stack_fffffffffffffaa8;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffffab0;
  int64_t in_stack_fffffffffffffab8;
  int64_t in_stack_fffffffffffffac0;
  TPZFMatrix<double> *in_stack_fffffffffffffac8;
  Fad<double> *in_stack_fffffffffffffaf0;
  int64_t in_stack_fffffffffffffaf8;
  TPZManVector<Fad<double>,_10> *in_stack_fffffffffffffb00;
  int local_3ac;
  int local_384;
  TPZVec<Fad<double>_> local_358 [11];
  undefined8 local_1e8;
  undefined8 local_100;
  undefined1 local_f8 [232];
  TPZVec<double> *local_10;
  
  local_100 = 0;
  pdVar2 = (double *)0x2;
  local_10 = in_RSI;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffa90,(int64_t)in_stack_fffffffffffffa88,
             (int64_t)in_stack_fffffffffffffa80,(double *)0x2);
  local_1e8 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffa90,(int64_t)in_stack_fffffffffffffa88,
             (int64_t)in_stack_fffffffffffffa80,pdVar2);
  dec = (DecomposeType)((ulong)pdVar2 >> 0x20);
  (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x46])
            (in_RDI,local_10,local_f8);
  TPZFMatrix<double>::Resize
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  TPZMatrix<double>::Inverse(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,dec);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  Fad<double>::~Fad(in_stack_fffffffffffffa50);
  for (local_384 = 0; local_384 < 2; local_384 = local_384 + 1) {
    pdVar2 = TPZVec<double>::operator[](local_10,(long)local_384);
    Fad<double>::Fad((Fad<double> *)in_RDI,(int)((ulong)pdVar2 >> 0x20),
                     (double *)in_stack_fffffffffffffa60);
    TPZVec<Fad<double>_>::operator[](local_358,(long)local_384);
    Fad<double>::operator=
              (in_stack_fffffffffffffa50,
               (Fad<double> *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    Fad<double>::~Fad(in_stack_fffffffffffffa50);
    for (local_3ac = 0; local_3ac < 2; local_3ac = local_3ac + 1) {
      in_stack_fffffffffffffa60 =
           (TPZManVector<Fad<double>,_10> *)
           TPZFMatrix<double>::operator()(in_RDI,(int64_t)pdVar2,(int64_t)in_stack_fffffffffffffa60)
      ;
      in_stack_fffffffffffffa50 =
           (Fad<double> *)(in_stack_fffffffffffffa60->super_TPZVec<Fad<double>_>)._vptr_TPZVec;
      TPZVec<Fad<double>_>::operator[](local_358,(long)local_384);
      pdVar1 = Fad<double>::fastAccessDx(in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
      *pdVar1 = (double)in_stack_fffffffffffffa50;
    }
  }
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x48])
            (in_RDI,local_358,&stack0xfffffffffffffa80);
  pztopology::TPZTriangle::ComputeHDivDirections<Fad<double>>
            ((TPZFMatrix<Fad<double>_> *)gradxFad.fBuf[5].dx_._0_8_,
             (TPZFMatrix<Fad<double>_> *)gradxFad.fBuf[5].val_);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17a720f);
  TPZManVector<Fad<double>,_10>::~TPZManVector(in_stack_fffffffffffffa60);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x17a7229);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x17a7236);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<Fad<REAL>> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.),gradxinv(TGeo::Dimension,TGeo::Dimension,0.);
    
    this->GradX(pt, gradx);
    gradx.Resize(TGeo::Dimension,TGeo::Dimension);
    gradx.Inverse(gradxinv, ENoDecompose);
    
    TPZManVector<Fad<REAL>> qsiFad(TGeo::Dimension,0.);
    
    for(int i=0;i<TGeo::Dimension;i++){
        qsiFad[i] = Fad<REAL>(TGeo::Dimension,pt[i]);

        for(int j=0;j<TGeo::Dimension;j++){
            qsiFad[i].fastAccessDx(j)=gradxinv(i,j);
        }
    }
    //std::cout<<qsiFad<<std::endl;
    TPZFNMatrix<9,Fad<REAL>> gradxFad(3,TGeo::Dimension);
    this->GradX(qsiFad, gradxFad);
    //gradxFad.Print(std::cout);
    TGeo::ComputeHDivDirections(gradxFad, directions);
   
}